

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# burstsort2.cpp
# Opt level: O0

void burstsort2_sampling_vector_block(uchar **strings,size_t n)

{
  TrieNode<unsigned_char,_vector_block<unsigned_char_*,_128U>_> *root_00;
  TrieNode<unsigned_char,_vector_block<unsigned_char_*,_128U>_> *root;
  size_t n_local;
  uchar **strings_local;
  
  root_00 = pseudo_sample<unsigned_char,vector_block<unsigned_char*,128u>>(strings,n);
  insert<16384u,vector_block<unsigned_char*,128u>,BurstSimple<unsigned_char>,unsigned_char>
            (root_00,strings,n);
  traverse<void(*)(unsigned_char**,int,int),vector_block<unsigned_char*,128u>,unsigned_char>
            (root_00,strings,0,mkqsort);
  return;
}

Assistant:

void burstsort2_sampling_vector_block(unsigned char** strings, size_t n)
{
	typedef unsigned char CharT;
	typedef vector_block<unsigned char*, 128> BucketT;
	typedef BurstSimple<CharT> BurstImpl;
	TrieNode<CharT, BucketT>* root = pseudo_sample<CharT, BucketT>(strings, n);
	insert<16384, BucketT, BurstImpl>(root, strings, n);
	traverse(root, strings, 0, SmallSort);
}